

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  sqlite3_uint64 n;
  Fts3Hash *pH;
  bool bVar1;
  int iVar2;
  int iVar3;
  Fts3SegReader **__base;
  sqlite3_int64 iEndBlock;
  char *zNode;
  Fts3SegReader *pFVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  Fts3SegReader *pSeg;
  sqlite3_int64 *local_78;
  Fts3SegReader **local_70;
  uint local_68;
  uint local_64;
  char *local_60;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  int local_44;
  long local_40;
  Fts3Table *local_38;
  ulong __nmemb;
  
  local_64 = isScan;
  lVar7 = (long)iIndex;
  local_60 = zTerm;
  local_38 = p;
  if (-1 < iLevel) {
    local_78 = (sqlite3_int64 *)CONCAT44(local_78._4_4_,iLevel);
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar4 = pSeg;
    if (iVar2 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,
                         ((ulong)local_78 & 0xffffffff) +
                         ((long)p->nIndex * (long)iLangid + lVar7) * 0x400);
      iVar2 = 0;
    }
    goto LAB_001b2366;
  }
  iVar2 = 0;
  local_44 = iLangid;
  if (p->aIndex != (Fts3Index *)0x0) {
    uVar9 = isScan | isPrefix;
    pH = &p->aIndex[lVar7].hPending;
    iVar2 = 7;
    local_40 = lVar7;
    if (uVar9 != 0) {
      local_78 = (sqlite3_int64 *)CONCAT44(local_78._4_4_,iLevel);
      pSeg = (Fts3SegReader *)&pH->first;
      uVar6 = 0;
      uVar8 = 0;
      __base = (Fts3SegReader **)0x0;
      local_68 = uVar9;
      do {
        __nmemb = (ulong)uVar8;
        pFVar4 = pSeg;
        local_70 = __base;
        do {
          pFVar4 = *(Fts3SegReader **)pFVar4;
          pSeg = pFVar4;
          if (pFVar4 == (Fts3SegReader *)0x0) {
            if (1 < uVar8) {
              qsort(__base,__nmemb,8,fts3CompareElemByTerm);
              iLevel = (int)local_78;
              goto LAB_001b2518;
            }
            iLevel = (int)local_78;
            if (uVar8 != 1) {
              iVar2 = 0;
              bVar1 = true;
              goto LAB_001b2576;
            }
            uVar8 = 1;
            goto LAB_001b2518;
          }
        } while ((nTerm != 0) &&
                (((int)pFVar4->iCurrentBlock < nTerm ||
                 (iVar3 = bcmp((void *)pFVar4->iEndBlock,local_60,(long)nTerm), __base = local_70,
                 iVar3 != 0))));
        if (uVar8 == uVar6) {
          __base = (Fts3SegReader **)sqlite3_realloc(__base,uVar6 * 8 + 0x80);
          if (__base == (Fts3SegReader **)0x0) goto LAB_001b2661;
          uVar6 = uVar6 + 0x10;
        }
        uVar8 = uVar8 + 1;
        __base[__nmemb] = pFVar4;
      } while( true );
    }
    pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
    if (pSeg != (Fts3SegReader *)0x0) {
      uVar8 = 1;
      local_70 = &pSeg;
      local_68 = uVar9;
LAB_001b2518:
      n = (ulong)uVar8 * 8 + 0x90;
      pFVar4 = (Fts3SegReader *)sqlite3_malloc64(n);
      bVar1 = false;
      if (pFVar4 == (Fts3SegReader *)0x0) {
LAB_001b2576:
        pFVar4 = (Fts3SegReader *)0x0;
      }
      else {
        memset(pFVar4,0,n);
        pFVar4->iIdx = 0x7fffffff;
        pFVar4->ppNextElem = (Fts3HashElem **)(pFVar4 + 1);
        memcpy(pFVar4 + 1,local_70,(ulong)uVar8 << 3);
        bVar1 = true;
        iVar2 = 0;
      }
      goto LAB_001b2578;
    }
    iVar2 = 0;
    lVar7 = local_40;
  }
  goto LAB_001b25d0;
LAB_001b2661:
  bVar1 = false;
  pFVar4 = (Fts3SegReader *)0x0;
  iLevel = (int)local_78;
LAB_001b2578:
  p = local_38;
  if (local_68 != 0) {
    sqlite3_free(local_70);
  }
  lVar7 = local_40;
  if (bVar1 && pFVar4 != (Fts3SegReader *)0x0) {
    iVar2 = fts3SegReaderCursorAppend(pCsr,pFVar4);
  }
LAB_001b25d0:
  if (iLevel == -1) {
    pFVar4 = (Fts3SegReader *)0x0;
LAB_001b2495:
    iVar3 = sqlite3_reset((sqlite3_stmt *)pFVar4);
    if (iVar2 != 0x65) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  if (iVar2 == 0) {
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(p,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar4 = pSeg;
    if (iVar2 == 0) {
      lVar5 = (long)local_44;
      sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,(p->nIndex * lVar5 + lVar7) * 0x400);
      sqlite3_bind_int64((sqlite3_stmt *)pFVar4,2,(p->nIndex * lVar5 + lVar7) * 0x400 | 0x3ff);
      iVar2 = 0;
    }
  }
  else {
    pFVar4 = (Fts3SegReader *)0x0;
  }
LAB_001b2366:
  local_78 = &iLeavesEndBlock;
  if (isPrefix == 0) {
    local_78 = (sqlite3_int64 *)0x0;
  }
  local_64 = local_64 | isPrefix;
  local_70 = (Fts3SegReader **)CONCAT44(local_70._4_4_,(uint)(local_64 == 0));
  do {
    if ((iVar2 != 0) || (iVar2 = sqlite3_step((sqlite3_stmt *)pFVar4), iVar2 != 100))
    goto LAB_001b2495;
    pSeg = (Fts3SegReader *)0x0;
    iStartBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar4,1);
    iLeavesEndBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar4,2);
    iEndBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar4,3);
    iVar3 = sqlite3_column_bytes((sqlite3_stmt *)pFVar4,4);
    zNode = (char *)sqlite3_column_blob((sqlite3_stmt *)pFVar4,4);
    if ((local_60 != (char *)0x0) && ((iStartBlock != 0 && (zNode != (char *)0x0)))) {
      iVar2 = fts3SelectLeaf(local_38,local_60,nTerm,zNode,iVar3,&iStartBlock,local_78);
      if (iVar2 != 0) goto LAB_001b2495;
      if (local_64 == 0) {
        iLeavesEndBlock = iStartBlock;
      }
    }
    iVar2 = sqlite3Fts3SegReaderNew
                      (pCsr->nSegment + 1,(int)local_70,iStartBlock,iLeavesEndBlock,iEndBlock,zNode,
                       iVar3,&pSeg);
    if (iVar2 != 0) goto LAB_001b2495;
    iVar2 = fts3SegReaderCursorAppend(pCsr,pSeg);
  } while( true );
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader 
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by 
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }
 
      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1, 
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock, 
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}